

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_if_connect_udp(mg_connection *nc)

{
  int iVar1;
  int *piVar2;
  int local_14;
  mg_connection *nc_local;
  
  iVar1 = socket(2,2,0);
  nc->sock = iVar1;
  if (nc->sock < 0) {
    nc->sock = -1;
    piVar2 = __errno_location();
    if (*piVar2 == 0) {
      local_14 = 1;
    }
    else {
      piVar2 = __errno_location();
      local_14 = *piVar2;
    }
    nc->err = local_14;
  }
  else {
    nc->err = 0;
  }
  return;
}

Assistant:

void mg_if_connect_udp(struct mg_connection *nc) {
    nc->sock = socket(AF_INET, SOCK_DGRAM, 0);
    if (nc->sock < 0) {
        nc->sock = INVALID_SOCKET;
        nc->err = errno ? errno : 1;
        return;
    }
    nc->err = 0;
}